

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_clzi_i64_s390x(TCGContext_conflict12 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,uint64_t arg2)

{
  TCGv_i64 arg2_00;
  TCGv_i64 t;
  uint64_t arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict12 *tcg_ctx_local;
  
  arg2_00 = tcg_const_i64_s390x(tcg_ctx,arg2);
  tcg_gen_clz_i64_s390x(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_i64(tcg_ctx,arg2_00);
  return;
}

Assistant:

void tcg_gen_clzi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, uint64_t arg2)
{
#if TCG_TARGET_REG_BITS == 32 && TCG_TARGET_HAS_clz_i32
    if (arg2 <= 0xffffffffu) {
        TCGv_i32 t = tcg_const_i32(tcg_ctx, (uint32_t)arg2 - 32);
        tcg_gen_clz_i32(tcg_ctx, t, TCGV_LOW(tcg_ctx, arg1), t);
        tcg_gen_addi_i32(tcg_ctx, t, t, 32);
        tcg_gen_clz_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), t);
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
        tcg_temp_free_i32(tcg_ctx, t);
    } else
#endif
    {
        TCGv_i64 t = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_clz_i64(tcg_ctx, ret, arg1, t);
        tcg_temp_free_i64(tcg_ctx, t);
    }
}